

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitFactor.c
# Opt level: O2

void Kit_FactorTest(uint *pTruth,int nVars)

{
  int iVar1;
  Vec_Int_t *vMemory;
  Vec_Int_t *vMemory_00;
  Kit_Graph_t *pGraph;
  
  vMemory = Vec_IntAlloc((int)pTruth);
  iVar1 = Kit_TruthIsop(pTruth,nVars,vMemory,0);
  if (iVar1 == 0) {
    vMemory_00 = Vec_IntAlloc((int)pTruth);
    pGraph = Kit_SopFactor(vMemory,0,nVars,vMemory_00);
    printf("Vars = %2d. Cubes = %3d. FFNodes = %3d. FF_memory = %3d.\n",nVars,
           (ulong)(uint)vMemory->nSize,(ulong)(uint)(pGraph->nSize - pGraph->nLeaves),
           (ulong)(uint)vMemory_00->nSize);
    Vec_IntFree(vMemory_00);
    Vec_IntFree(vMemory);
    Kit_GraphFree(pGraph);
    return;
  }
  __assert_fail("RetValue == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bool/kit/kitFactor.c"
                ,0x13e,"void Kit_FactorTest(unsigned int *, int)");
}

Assistant:

void Kit_FactorTest( unsigned * pTruth, int nVars )
{
    Vec_Int_t * vCover, * vMemory;
    Kit_Graph_t * pGraph;
//    unsigned uTruthRes;
    int RetValue;

    // derive SOP
    vCover = Vec_IntAlloc( 0 );
    RetValue = Kit_TruthIsop( pTruth, nVars, vCover, 0 );
    assert( RetValue == 0 );

    // derive factored form
    vMemory = Vec_IntAlloc( 0 );
    pGraph = Kit_SopFactor( vCover, 0, nVars, vMemory );
/*
    // derive truth table
    assert( nVars <= 5 );
    uTruthRes = Kit_GraphToTruth( pGraph );
    if ( uTruthRes != pTruth[0] )
        printf( "Verification failed!" );
*/
    printf( "Vars = %2d. Cubes = %3d. FFNodes = %3d. FF_memory = %3d.\n",
        nVars, Vec_IntSize(vCover), Kit_GraphNodeNum(pGraph), Vec_IntSize(vMemory) );

    Vec_IntFree( vMemory );
    Vec_IntFree( vCover );
    Kit_GraphFree( pGraph );
}